

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O2

int __thiscall ModelWriter::shape_inference(ModelWriter *this)

{
  Option *pOVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  pointer pBVar5;
  pointer pBVar6;
  Layer *pLVar7;
  pointer pBVar8;
  Allocator *pAVar9;
  pointer pMVar10;
  long *plVar11;
  undefined8 uVar12;
  bool bVar13;
  char cVar14;
  int iVar15;
  int *piVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  Mat *pMVar20;
  size_t j;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  Mat local_98;
  ulong local_50;
  Extractor ex;
  
  if (this->has_custom_layer == true) {
    fwrite("model has custom layer, shape_inference skipped\n",0x30,1,_stderr);
LAB_0015adf6:
    iVar15 = -1;
  }
  else {
    pBVar5 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar6 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_50 = (long)(this->layers->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->layers->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    pOVar1 = &(this->super_Net).opt;
    for (uVar21 = 0; local_50 != uVar21; uVar21 = uVar21 + 1) {
      pLVar7 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar21];
      (*pLVar7->_vptr_Layer[5])(pLVar7,pOVar1);
      iVar15 = (*pLVar7->_vptr_Layer[4])(pLVar7,pOVar1);
      if (iVar15 != 0) {
        fprintf(_stderr,"layer create_pipeline %d %s failed",uVar21 & 0xffffffff,
                (pLVar7->name)._M_dataplus._M_p);
        fputc(10,_stderr);
        goto LAB_0015adf6;
      }
    }
    ncnn::Net::create_extractor((Net *)&ex);
    ncnn::Extractor::set_light_mode(&ex,true);
    for (uVar21 = 0; local_50 != uVar21; uVar21 = uVar21 + 1) {
      pLVar7 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar21];
      bVar13 = std::operator==(&pLVar7->type,"ncnnfused");
      if (!bVar13) {
        bVar13 = std::operator!=(&pLVar7->type,"Input");
        if (!bVar13) {
          iVar15 = *(int *)&pLVar7[1]._vptr_Layer;
          iVar3 = *(int *)((long)&pLVar7[1]._vptr_Layer + 4);
          iVar4._0_1_ = pLVar7[1].support_bf16_storage;
          iVar4._1_1_ = pLVar7[1].support_fp16_storage;
          iVar4._2_1_ = pLVar7[1].support_int8_storage;
          iVar4._3_1_ = pLVar7[1].support_image_storage;
          bVar22 = iVar15 != 0;
          bVar13 = (iVar3 == 0 && iVar4 == 0) && bVar22;
          bVar23 = iVar3 == 0;
          bVar24 = iVar4 == 0;
          cVar14 = bVar13;
          if (bVar24) {
            cVar14 = '\x02';
          }
          if (bVar23 || !bVar22) {
            cVar14 = bVar13;
          }
          if (!bVar24 && (!bVar23 && bVar22)) {
            cVar14 = '\x03';
          }
          if (cVar14 == '\0') {
            fprintf(_stderr,"Input layer %s without shape info, shape_inference skipped\n",
                    (pLVar7->name)._M_dataplus._M_p);
            iVar15 = -1;
            goto LAB_0015b318;
          }
          local_98.cstep = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.elemsize._0_4_ = 0;
          local_98.elemsize._4_4_ = 0;
          local_98.elempack = 0;
          local_98.h = 0;
          local_98.d = 0;
          local_98.c = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          if (cVar14 == '\x03') {
LAB_0015ad4d:
            ncnn::Mat::create(&local_98,iVar15,iVar3,iVar4,4,(Allocator *)0x0);
          }
          else if (cVar14 == '\x02') {
            ncnn::Mat::create(&local_98,iVar15,iVar3,4,(Allocator *)0x0);
            if (!bVar24 && (!bVar23 && bVar22)) goto LAB_0015ad4d;
          }
          else {
            ncnn::Mat::create(&local_98,iVar15,4,(Allocator *)0x0);
          }
          ncnn::Extractor::input
                    (&ex,*(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,&local_98);
          piVar16 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (local_98.allocator == (Allocator *)0x0) {
                free(local_98.data);
              }
              else {
                (*(local_98.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
      }
    }
    for (lVar18 = 0; lVar18 != ((long)pBVar5 - (long)pBVar6) / 0x70; lVar18 = lVar18 + 1) {
      pBVar8 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar15 = pBVar8[lVar18].shape.dims;
      if (iVar15 != 0) {
        iVar3 = pBVar8[lVar18].shape.w;
        iVar4 = pBVar8[lVar18].shape.h;
        local_98.cstep = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.h = 0;
        local_98.d = 0;
        local_98.c = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        if (iVar15 == 3) {
          ncnn::Mat::create(&local_98,iVar3,iVar4,pBVar8[lVar18].shape.c,4,(Allocator *)0x0);
        }
        else if (iVar15 == 2) {
          ncnn::Mat::create(&local_98,iVar3,iVar4,4,(Allocator *)0x0);
        }
        else if (iVar15 == 1) {
          ncnn::Mat::create(&local_98,iVar3,4,(Allocator *)0x0);
        }
        iVar15 = local_98.c * (int)local_98.cstep;
        if (local_98.c * (int)local_98.cstep < 1) {
          iVar15 = 0;
        }
        for (lVar17 = 0; iVar15 != (int)lVar17; lVar17 = lVar17 + 1) {
          *(undefined4 *)((long)local_98.data + lVar17 * 4) = 0;
        }
        ncnn::Extractor::input(&ex,(int)lVar18,&local_98);
        piVar16 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              free(local_98.data);
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
    fwrite("shape_inference\n",0x10,1,_stderr);
    for (uVar21 = 0; uVar21 != local_50; uVar21 = uVar21 + 1) {
      pLVar7 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar21];
      bVar13 = std::operator==(&pLVar7->type,"ncnnfused");
      if (!bVar13) {
        for (uVar19 = 0;
            lVar18 = *(long *)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data,
            uVar19 < (ulong)((long)(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - lVar18 >> 2);
            uVar19 = uVar19 + 1) {
          iVar15 = *(int *)(lVar18 + uVar19 * 4);
          local_98.cstep = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.elemsize._0_4_ = 0;
          local_98.elemsize._4_4_ = 0;
          local_98.elempack = 0;
          local_98.h = 0;
          local_98.d = 0;
          local_98.c = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          ncnn::Extractor::extract(&ex,iVar15,&local_98,0);
          pBVar5 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pMVar20 = &pBVar5[iVar15].shape;
          piVar16 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
          if (pMVar20 != &local_98) {
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + 1;
              UNLOCK();
            }
            piVar16 = pBVar5[iVar15].shape.refcount;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                pAVar9 = pBVar5[iVar15].shape.allocator;
                if (pAVar9 == (Allocator *)0x0) {
                  free(pMVar20->data);
                }
                else {
                  (*pAVar9->_vptr_Allocator[3])();
                }
              }
            }
            pBVar5[iVar15].shape.cstep = 0;
            pMVar20->data = (void *)0x0;
            pBVar5[iVar15].shape.refcount = (int *)0x0;
            *(undefined8 *)((long)&pBVar5[iVar15].shape.refcount + 4) = 0;
            *(undefined8 *)((long)&pBVar5[iVar15].shape.elemsize + 4) = 0;
            pBVar5[iVar15].shape.dims = 0;
            pBVar5[iVar15].shape.w = 0;
            pBVar5[iVar15].shape.h = 0;
            pBVar5[iVar15].shape.d = 0;
            pBVar5[iVar15].shape.c = 0;
            pMVar20->data = local_98.data;
            piVar16 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
            pBVar5[iVar15].shape.refcount = piVar16;
            pBVar5[iVar15].shape.elemsize =
                 CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
            pBVar5[iVar15].shape.elempack = local_98.elempack;
            pBVar5[iVar15].shape.allocator = local_98.allocator;
            pBVar5[iVar15].shape.dims = local_98.dims;
            pBVar5[iVar15].shape.w = local_98.w;
            pBVar5[iVar15].shape.h = local_98.h;
            pBVar5[iVar15].shape.d = local_98.d;
            pBVar5[iVar15].shape.c = local_98.c;
            pBVar5[iVar15].shape.cstep = local_98.cstep;
          }
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (local_98.allocator == (Allocator *)0x0) {
                free(local_98.data);
              }
              else {
                (*(local_98.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
      }
    }
    for (uVar21 = 0; uVar21 != local_50; uVar21 = uVar21 + 1) {
      pLVar7 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar21];
      bVar13 = std::operator==(&pLVar7->type,"ncnnfused");
      if (!bVar13) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                  (&pLVar7->bottom_shapes,
                   (long)(pLVar7->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   *(long *)&(pLVar7->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data >> 2);
        lVar18 = 0;
        for (uVar19 = 0;
            lVar17 = *(long *)&(pLVar7->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data,
            uVar19 < (ulong)((long)(pLVar7->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - lVar17 >> 2);
            uVar19 = uVar19 + 1) {
          iVar15 = *(int *)(lVar17 + uVar19 * 4);
          pBVar5 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pMVar10 = (pLVar7->bottom_shapes).
                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar2 = (undefined8 *)((long)&pMVar10->data + lVar18);
          if ((Mat *)puVar2 != &pBVar5[iVar15].shape) {
            piVar16 = pBVar5[iVar15].shape.refcount;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + 1;
              UNLOCK();
            }
            piVar16 = *(int **)((long)&pMVar10->refcount + lVar18);
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                plVar11 = *(long **)((long)&pMVar10->allocator + lVar18);
                if (plVar11 == (long *)0x0) {
                  free(*(void **)((long)&pMVar10->data + lVar18));
                }
                else {
                  (**(code **)(*plVar11 + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&pMVar10->cstep + lVar18) = 0;
            *(undefined8 *)((long)puVar2 + 0xc) = 0;
            *(undefined8 *)((long)puVar2 + 0x14) = 0;
            *puVar2 = 0;
            puVar2[1] = 0;
            *(undefined4 *)((long)&pMVar10->c + lVar18) = 0;
            puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar18);
            *puVar2 = 0;
            puVar2[1] = 0;
            piVar16 = pBVar5[iVar15].shape.refcount;
            puVar2 = (undefined8 *)((long)&pMVar10->data + lVar18);
            *puVar2 = pBVar5[iVar15].shape.data;
            puVar2[1] = piVar16;
            *(size_t *)((long)&pMVar10->elemsize + lVar18) = pBVar5[iVar15].shape.elemsize;
            *(int *)((long)&pMVar10->elempack + lVar18) = pBVar5[iVar15].shape.elempack;
            *(Allocator **)((long)&pMVar10->allocator + lVar18) = pBVar5[iVar15].shape.allocator;
            uVar12 = *(undefined8 *)&pBVar5[iVar15].shape.h;
            puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar18);
            *puVar2 = *(undefined8 *)&pBVar5[iVar15].shape.dims;
            puVar2[1] = uVar12;
            *(int *)((long)&pMVar10->c + lVar18) = pBVar5[iVar15].shape.c;
            *(size_t *)((long)&pMVar10->cstep + lVar18) = pBVar5[iVar15].shape.cstep;
          }
          lVar18 = lVar18 + 0x48;
        }
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                  (&pLVar7->top_shapes,
                   (long)(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   *(long *)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data >> 2);
        lVar18 = 0;
        uVar19 = 0;
        while( true ) {
          lVar17 = *(long *)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data;
          if ((ulong)((long)(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - lVar17 >> 2) <= uVar19) break;
          iVar15 = *(int *)(lVar17 + uVar19 * 4);
          pBVar5 = (this->blobs->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pMVar10 = (pLVar7->top_shapes).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar2 = (undefined8 *)((long)&pMVar10->data + lVar18);
          if ((Mat *)puVar2 != &pBVar5[iVar15].shape) {
            piVar16 = pBVar5[iVar15].shape.refcount;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + 1;
              UNLOCK();
            }
            piVar16 = *(int **)((long)&pMVar10->refcount + lVar18);
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                plVar11 = *(long **)((long)&pMVar10->allocator + lVar18);
                if (plVar11 == (long *)0x0) {
                  free(*(void **)((long)&pMVar10->data + lVar18));
                }
                else {
                  (**(code **)(*plVar11 + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&pMVar10->cstep + lVar18) = 0;
            *(undefined8 *)((long)puVar2 + 0xc) = 0;
            *(undefined8 *)((long)puVar2 + 0x14) = 0;
            *puVar2 = 0;
            puVar2[1] = 0;
            *(undefined4 *)((long)&pMVar10->c + lVar18) = 0;
            puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar18);
            *puVar2 = 0;
            puVar2[1] = 0;
            piVar16 = pBVar5[iVar15].shape.refcount;
            puVar2 = (undefined8 *)((long)&pMVar10->data + lVar18);
            *puVar2 = pBVar5[iVar15].shape.data;
            puVar2[1] = piVar16;
            *(size_t *)((long)&pMVar10->elemsize + lVar18) = pBVar5[iVar15].shape.elemsize;
            *(int *)((long)&pMVar10->elempack + lVar18) = pBVar5[iVar15].shape.elempack;
            *(Allocator **)((long)&pMVar10->allocator + lVar18) = pBVar5[iVar15].shape.allocator;
            uVar12 = *(undefined8 *)&pBVar5[iVar15].shape.h;
            puVar2 = (undefined8 *)((long)&pMVar10->dims + lVar18);
            *puVar2 = *(undefined8 *)&pBVar5[iVar15].shape.dims;
            puVar2[1] = uVar12;
            *(int *)((long)&pMVar10->c + lVar18) = pBVar5[iVar15].shape.c;
            *(size_t *)((long)&pMVar10->cstep + lVar18) = pBVar5[iVar15].shape.cstep;
          }
          uVar19 = uVar19 + 1;
          lVar18 = lVar18 + 0x48;
        }
      }
    }
    iVar15 = 0;
LAB_0015b318:
    ncnn::Extractor::~Extractor(&ex);
  }
  return iVar15;
}

Assistant:

int ModelWriter::shape_inference()
{
    if (has_custom_layer)
    {
        fprintf(stderr, "model has custom layer, shape_inference skipped\n");
        return -1;
    }

    const size_t layer_count = layers.size();
    const size_t blob_count = blobs.size();

    // recreate layer pipeline for param and weight changes
    for (size_t i = 0; i < layer_count; i++)
    {
        ncnn::Layer* layer = layers[i];

        layer->destroy_pipeline(opt);

        int cret = layer->create_pipeline(opt);
        if (cret != 0)
        {
            NCNN_LOGE("layer create_pipeline %d %s failed", (int)i, layer->name.c_str());
            return -1;
        }
    }

    ncnn::Extractor ex = create_extractor();
    ex.set_light_mode(true);

    // prepare Input blobs
    for (size_t i = 0; i < layer_count; i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        if (layer->type != "Input")
            continue;

        ncnn::Input* input = (ncnn::Input*)layer;

        int w = input->w;
        int h = input->h;
        int c = input->c;

        int dims = 0;
        if (w == 0 && h == 0 && c == 0) dims = 0;
        if (w != 0 && h == 0 && c == 0) dims = 1;
        if (w != 0 && h != 0 && c == 0) dims = 2;
        if (w != 0 && h != 0 && c != 0) dims = 3;

        if (dims == 0)
        {
            fprintf(stderr, "Input layer %s without shape info, shape_inference skipped\n", layer->name.c_str());
            return -1;
        }

        ncnn::Mat m;
        if (dims == 1) m.create(w);
        if (dims == 2) m.create(w, h);
        if (dims == 3) m.create(w, h, c);

        ex.input(layer->tops[0], m);
    }

    // prepare blobs with predefined shape
    for (size_t i = 0; i < blob_count; i++)
    {
        const ncnn::Blob& blob = blobs[i];

        int dims = blob.shape.dims;
        int w = blob.shape.w;
        int h = blob.shape.h;
        int c = blob.shape.c;

        if (dims == 0)
            continue;

        ncnn::Mat m;
        if (dims == 1) m.create(w);
        if (dims == 2) m.create(w, h);
        if (dims == 3) m.create(w, h, c);

        m.fill(0.f);

        ex.input(int(i), m);
    }

    fprintf(stderr, "shape_inference\n");

    // resolve all layer output blob shape
    for (size_t i = 0; i < layer_count; i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        for (size_t j = 0; j < layer->tops.size(); j++)
        {
            int top_blob_index = layer->tops[j];

            ncnn::Mat m;
            ex.extract(top_blob_index, m);

            blobs[top_blob_index].shape = m;
        }
    }

    // assign all layer blob shape
    for (size_t i = 0; i < layer_count; i++)
    {
        ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        layer->bottom_shapes.resize(layer->bottoms.size());
        for (size_t j = 0; j < layer->bottoms.size(); j++)
        {
            int bottom_blob_index = layer->bottoms[j];

            layer->bottom_shapes[j] = blobs[bottom_blob_index].shape;
        }

        layer->top_shapes.resize(layer->tops.size());
        for (size_t j = 0; j < layer->tops.size(); j++)
        {
            int top_blob_index = layer->tops[j];

            layer->top_shapes[j] = blobs[top_blob_index].shape;

            //             fprintf(stderr, "%d %4d %4d %4d | %2d %s\n", blobs[top_blob_index].shape.dims, blobs[top_blob_index].shape.w, blobs[top_blob_index].shape.h, blobs[top_blob_index].shape.c, top_blob_index, blobs[top_blob_index].name.c_str());
        }
    }

    return 0;
}